

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  int iVar1;
  uint uVar2;
  MemPage *pMVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  bVar4 = pCur->eState;
  if (1 < bVar4) {
    iVar6 = btreeRestoreCursorPosition(pCur);
    if (iVar6 != 0) {
      return iVar6;
    }
    bVar4 = pCur->eState;
  }
  pCur->atLast = '\0';
  iVar10 = 1;
  iVar6 = 0;
  iVar9 = 0;
  if (bVar4 != 0) {
    iVar1 = pCur->skipNext;
    pCur->skipNext = 0;
    if (-1 < iVar1) {
      sVar5 = pCur->iPage;
      lVar7 = (long)sVar5;
      pMVar3 = pCur->apPage[lVar7];
      uVar8 = (ulong)pCur->aiIdx[lVar7];
      if (pMVar3->leaf == '\0') {
        uVar2 = *(uint *)(pMVar3->aData +
                         (CONCAT11(pMVar3->aCellIdx[uVar8 * 2],pMVar3->aCellIdx[uVar8 * 2 + 1]) &
                         pMVar3->maskPage));
        iVar6 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                                 uVar2 << 0x18);
        if (iVar6 != 0) {
          return iVar6;
        }
        iVar6 = moveToRightmost(pCur);
      }
      else {
        if (uVar8 == 0) {
          do {
            if (sVar5 == 0) {
              pCur->eState = '\0';
              goto LAB_0016bdb0;
            }
            moveToParent(pCur);
            sVar5 = pCur->iPage;
            lVar7 = (long)sVar5;
          } while (pCur->aiIdx[lVar7] == 0);
        }
        (pCur->info).nSize = 0;
        pCur->validNKey = '\0';
        pCur->aiIdx[lVar7] = pCur->aiIdx[lVar7] - 1;
        if ((pCur->apPage[pCur->iPage]->intKey != '\0') && (pCur->apPage[pCur->iPage]->leaf == '\0')
           ) {
          iVar6 = sqlite3BtreePrevious(pCur,pRes);
        }
      }
    }
    iVar9 = iVar6;
    iVar10 = 0;
  }
LAB_0016bdb0:
  *pRes = iVar10;
  return iVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  int rc;
  MemPage *pPage;

  assert( cursorHoldsMutex(pCur) );
  rc = restoreCursorPosition(pCur);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pCur->atLast = 0;
  if( CURSOR_INVALID==pCur->eState ){
    *pRes = 1;
    return SQLITE_OK;
  }
  if( pCur->skipNext<0 ){
    pCur->skipNext = 0;
    *pRes = 0;
    return SQLITE_OK;
  }
  pCur->skipNext = 0;

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->aiIdx[pCur->iPage];
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ){
      return rc;
    }
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->aiIdx[pCur->iPage]==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        *pRes = 1;
        return SQLITE_OK;
      }
      moveToParent(pCur);
    }
    pCur->info.nSize = 0;
    pCur->validNKey = 0;

    pCur->aiIdx[pCur->iPage]--;
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, pRes);
    }else{
      rc = SQLITE_OK;
    }
  }
  *pRes = 0;
  return rc;
}